

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_extra.c
# Opt level: O3

void duckdb_je_pa_shard_basic_stats_merge
               (pa_shard_t *shard,size_t *nactive,size_t *ndirty,size_t *nmuzzy)

{
  size_t sVar1;
  size_t sVar2;
  
  *nactive = *nactive + (shard->nactive).repr;
  sVar1 = duckdb_je_pa_shard_ndirty(shard);
  *ndirty = *ndirty + sVar1;
  sVar1 = duckdb_je_eset_npages_get(&(shard->pac).ecache_muzzy.eset);
  sVar2 = duckdb_je_eset_npages_get(&(shard->pac).ecache_muzzy.guarded_eset);
  *nmuzzy = *nmuzzy + sVar2 + sVar1;
  return;
}

Assistant:

void
pa_shard_basic_stats_merge(pa_shard_t *shard, size_t *nactive, size_t *ndirty,
    size_t *nmuzzy) {
	*nactive += pa_shard_nactive(shard);
	*ndirty += pa_shard_ndirty(shard);
	*nmuzzy += pa_shard_nmuzzy(shard);
}